

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,MinConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>_>
          *prepro)

{
  int *piVar1;
  Type TVar2;
  const_iterator __end0;
  const_iterator __begin0;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  piVar3 = (c->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (c->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 == piVar1) {
    dVar8 = INFINITY;
    dVar7 = INFINITY;
  }
  else {
    piVar4 = piVar3;
    dVar7 = INFINITY;
    do {
      dVar8 = *(double *)(*(long *)(this + 0x40) + (long)*piVar4 * 8);
      if (dVar7 <= dVar8) {
        dVar8 = dVar7;
      }
      piVar4 = piVar4 + 1;
      dVar7 = dVar8;
    } while (piVar4 != piVar1);
    dVar9 = INFINITY;
    do {
      dVar7 = *(double *)(*(long *)(this + 0x58) + (long)*piVar3 * 8);
      if (dVar9 <= dVar7) {
        dVar7 = dVar9;
      }
      piVar3 = piVar3 + 1;
      dVar9 = dVar7;
    } while (piVar3 != piVar1);
  }
  uVar5 = -(ulong)(prepro->lb_ < dVar8);
  uVar6 = -(ulong)(dVar7 < prepro->ub_);
  prepro->lb_ = (double)(~uVar5 & (ulong)prepro->lb_ | (ulong)dVar8 & uVar5);
  prepro->ub_ = (double)(~uVar6 & (ulong)prepro->ub_ | (ulong)dVar7 & uVar6);
  TVar2 = FlatModel<mp::DefaultFlatModelParams>::common_type<std::vector<int,std::allocator<int>>>
                    ((FlatModel<mp::DefaultFlatModelParams> *)this,
                     &(c->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MinId>
                      ).args_);
  prepro->type_ = TVar2;
  return;
}

Assistant:

void PreprocessConstraint(
      MinConstraint& c, PreprocessInfo& prepro) {
    auto& m = MP_DISPATCH( GetModel() );
    auto& args = c.GetArguments();
    prepro.narrow_result_bounds( m.lb_array(args),
                          m.ub_min_array(args) );
    prepro.set_result_type( m.common_type(args) );
  }